

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall
rtb::Filter::Filter<double>::setTransferFunction(Filter<double> *this,TransferFunction<double> *tf)

{
  size_type __new_size;
  size_t sVar1;
  
  (this->tf_).samplingFrequency_ = tf->samplingFrequency_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&(this->tf_).numerator_.coefficients_,&(tf->numerator_).coefficients_);
  sVar1 = (tf->numerator_).size_;
  (this->tf_).numerator_.order_ = (tf->numerator_).order_;
  (this->tf_).numerator_.size_ = sVar1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&(this->tf_).denominator_.coefficients_,&(tf->denominator_).coefficients_);
  (this->tf_).denominator_.order_ = (tf->denominator_).order_;
  __new_size = (tf->denominator_).size_;
  (this->tf_).denominator_.size_ = __new_size;
  this->n_ = __new_size;
  this->m_ = (this->tf_).numerator_.size_;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->y_,__new_size);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->x_,this->m_);
  resetState(this);
  return;
}

Assistant:

void Filter<T>::setTransferFunction(const TransferFunction<T>& tf) {
            tf_ = tf;
            n_ = tf_.getDenominatorSize();
            m_ = tf_.getNumeratorSize();
            y_.resize(n_);
            x_.resize(m_);
            resetState();
        }